

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,duckdb::date_t>
          (TryCast *this,string_t input,date_t *result,bool strict)

{
  DateCastResult DVar1;
  char *buf;
  bool special;
  idx_t pos;
  bool local_19;
  idx_t local_18;
  undefined8 local_10;
  char *local_8;
  
  local_8 = input.value._0_8_;
  local_19 = false;
  buf = (char *)((long)&local_10 + 4);
  if (0xc < ((ulong)this & 0xffffffff)) {
    buf = local_8;
  }
  local_10 = this;
  DVar1 = Date::TryConvertDate
                    (buf,(ulong)this & 0xffffffff,&local_18,input.value._8_8_,&local_19,
                     SUB81(result,0));
  return DVar1 == SUCCESS;
}

Assistant:

bool TryCast::Operation(string_t input, date_t &result, bool strict) {
	idx_t pos;
	bool special = false;
	return Date::TryConvertDate(input.GetData(), input.GetSize(), pos, result, special, strict) ==
	       DateCastResult::SUCCESS;
}